

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_null_implementation.cpp
# Opt level: O0

vector<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_> *
__thiscall
hrgls::API::GetAvailableDataBlobSources
          (vector<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_>
           *__return_storage_ptr__,API *this)

{
  API *this_local;
  vector<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_> *ret;
  
  if (this->m_private == (API_private *)0x0) {
    std::vector<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_>
    ::vector(__return_storage_ptr__);
  }
  else {
    std::vector<hrgls::DataBlobSourceDescription,_std::allocator<hrgls::DataBlobSourceDescription>_>
    ::vector(__return_storage_ptr__,&this->m_private->rends);
  }
  return __return_storage_ptr__;
}

Assistant:

::std::vector<DataBlobSourceDescription> API::GetAvailableDataBlobSources() const
  {
    if (!m_private) {
      ::std::vector<DataBlobSourceDescription> ret;
      return ret;
    } else {
      return m_private->rends;
    }
  }